

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall mocker::ir::Interpreter::initExternalFuncs(Interpreter *this)

{
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_false,_true>,_bool>
  pVar1;
  anon_class_1_0_00000001 local_179;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  local_178;
  undefined1 local_170;
  anon_class_8_1_8991fb9c local_168;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  local_160;
  undefined1 local_158;
  anon_class_8_1_8991fb9c local_150;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  local_148;
  undefined1 local_140;
  anon_class_8_1_8991fb9c local_138;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  local_130;
  undefined1 local_128;
  anon_class_8_1_8991fb9c local_120;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  local_118;
  undefined1 local_110;
  anon_class_8_1_8991fb9c local_108;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  local_100;
  undefined1 local_f8;
  anon_class_8_1_8991fb9c local_f0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  local_e8;
  undefined1 local_e0;
  anon_class_1_0_00000001 local_d1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  local_d0;
  undefined1 local_c8;
  anon_class_1_0_00000001 local_b9;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  local_b8;
  undefined1 local_b0;
  anon_class_1_0_00000001 local_a1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  local_a0;
  undefined1 local_98;
  anon_class_1_0_00000001 local_89;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  local_88;
  undefined1 local_80;
  anon_class_8_1_8991fb9c local_78;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  local_70;
  undefined1 local_68;
  anon_class_8_1_8991fb9c local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  local_58;
  undefined1 local_50;
  anon_class_1_0_00000001 local_41;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  local_40;
  undefined1 local_38;
  anon_class_1_0_00000001 local_29;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
  local_28;
  undefined1 local_20;
  anon_class_8_1_8991fb9c local_18;
  Interpreter *local_10;
  Interpreter *this_local;
  
  local_18.this = this;
  local_10 = this;
  pVar1 = std::
          unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
          ::emplace<char_const(&)[16],mocker::ir::Interpreter::initExternalFuncs()::__0>
                    ((unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
                      *)&this->externalFuncs,(char (*) [16])"#_array_#_ctor_",&local_18);
  local_28._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
       ._M_cur;
  local_20 = pVar1.second;
  pVar1 = std::
          unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
          ::emplace<char_const(&)[14],mocker::ir::Interpreter::initExternalFuncs()::__1>
                    ((unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
                      *)&this->externalFuncs,(char (*) [14])"#_array_#size",&local_29);
  local_40._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
       ._M_cur;
  local_38 = pVar1.second;
  pVar1 = std::
          unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
          ::emplace<char_const(&)[15],mocker::ir::Interpreter::initExternalFuncs()::__2>
                    ((unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
                      *)&this->externalFuncs,(char (*) [15])"#string#length",&local_41);
  local_58._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
       ._M_cur;
  local_50 = pVar1.second;
  local_60.this = this;
  pVar1 = std::
          unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
          ::emplace<char_const(&)[12],mocker::ir::Interpreter::initExternalFuncs()::__3>
                    ((unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
                      *)&this->externalFuncs,(char (*) [12])"#string#add",&local_60);
  local_70._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
       ._M_cur;
  local_68 = pVar1.second;
  local_78.this = this;
  pVar1 = std::
          unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
          ::emplace<char_const(&)[18],mocker::ir::Interpreter::initExternalFuncs()::__4>
                    ((unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
                      *)&this->externalFuncs,(char (*) [18])"#string#substring",&local_78);
  local_88._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
       ._M_cur;
  local_80 = pVar1.second;
  pVar1 = std::
          unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
          ::emplace<char_const(&)[12],mocker::ir::Interpreter::initExternalFuncs()::__5>
                    ((unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
                      *)&this->externalFuncs,(char (*) [12])"#string#ord",&local_89);
  local_a0._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
       ._M_cur;
  local_98 = pVar1.second;
  pVar1 = std::
          unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
          ::emplace<char_const(&)[17],mocker::ir::Interpreter::initExternalFuncs()::__6>
                    ((unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
                      *)&this->externalFuncs,(char (*) [17])"#string#parseInt",&local_a1);
  local_b8._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
       ._M_cur;
  local_b0 = pVar1.second;
  pVar1 = std::
          unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
          ::emplace<char_const(&)[15],mocker::ir::Interpreter::initExternalFuncs()::__7>
                    ((unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
                      *)&this->externalFuncs,(char (*) [15])"#string#_ctor_",&local_b9);
  local_d0._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
       ._M_cur;
  local_c8 = pVar1.second;
  pVar1 = std::
          unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
          ::emplace<char_const(&)[7],mocker::ir::Interpreter::initExternalFuncs()::__8>
                    ((unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
                      *)&this->externalFuncs,(char (*) [7])"getInt",&local_d1);
  local_e8._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
       ._M_cur;
  local_e0 = pVar1.second;
  local_f0.this = this;
  pVar1 = std::
          unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
          ::emplace<char_const(&)[6],mocker::ir::Interpreter::initExternalFuncs()::__9>
                    ((unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
                      *)&this->externalFuncs,(char (*) [6])"print",&local_f0);
  local_100._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
       ._M_cur;
  local_f8 = pVar1.second;
  local_108.this = this;
  pVar1 = std::
          unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
          ::emplace<char_const(&)[8],mocker::ir::Interpreter::initExternalFuncs()::__10>
                    ((unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
                      *)&this->externalFuncs,(char (*) [8])"println",&local_108);
  local_118._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
       ._M_cur;
  local_110 = pVar1.second;
  local_120.this = this;
  pVar1 = std::
          unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
          ::emplace<char_const(&)[10],mocker::ir::Interpreter::initExternalFuncs()::__11>
                    ((unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
                      *)&this->externalFuncs,(char (*) [10])"_printInt",&local_120);
  local_130._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
       ._M_cur;
  local_128 = pVar1.second;
  local_138.this = this;
  pVar1 = std::
          unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
          ::emplace<char_const(&)[12],mocker::ir::Interpreter::initExternalFuncs()::__12>
                    ((unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
                      *)&this->externalFuncs,(char (*) [12])"_printlnInt",&local_138);
  local_148._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
       ._M_cur;
  local_140 = pVar1.second;
  local_150.this = this;
  pVar1 = std::
          unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
          ::emplace<char_const(&)[10],mocker::ir::Interpreter::initExternalFuncs()::__13>
                    ((unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
                      *)&this->externalFuncs,(char (*) [10])"getString",&local_150);
  local_160._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
       ._M_cur;
  local_158 = pVar1.second;
  local_168.this = this;
  pVar1 = std::
          unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
          ::emplace<char_const(&)[9],mocker::ir::Interpreter::initExternalFuncs()::__14>
                    ((unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
                      *)&this->externalFuncs,(char (*) [9])"toString",&local_168);
  local_178._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>,_true>
       ._M_cur;
  local_170 = pVar1.second;
  std::
  unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
  ::emplace<char_const(&)[7],mocker::ir::Interpreter::initExternalFuncs()::__15>
            ((unordered_map<std::__cxx11::string,std::function<long(std::vector<long,std::allocator<long>>const&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<long(std::vector<long,std::allocator<long>>const&)>>>>
              *)&this->externalFuncs,(char (*) [7])"memcpy",&local_179);
  return;
}

Assistant:

void Interpreter::initExternalFuncs() {
  using Args = const std::vector<std::int64_t> &;

  // #_array_#_ctor_ ( this arraySize elementSize )
  externalFuncs.emplace("#_array_#_ctor_",
                        [this](Args args) -> std::int64_t { assert(false); });
  // #_array_#size ( this )
  externalFuncs.emplace("#_array_#size", [](Args args) {
    auto res = *((std::int64_t *)(args[0]) - 1);
    return res;
  });

  // #string#length ( this )
  externalFuncs.emplace("#string#length", [](Args args) {
    auto res = *((std::int64_t *)(args[0]) - 1);
    return res;
  });
  // #string#add ( lhs rhs )
  externalFuncs.emplace("#string#add", [this](Args args) {
    auto lhsLen = externalFuncs["#string#length"]({args[0]});
    auto rhsLen = externalFuncs["#string#length"]({args[1]});
    std::int64_t length = lhsLen + rhsLen;

    char *resInstPtr = (char *)fastMalloc(length + 8);
    *(std::int64_t *)resInstPtr = length;
    resInstPtr += 8;

    std::memcpy(resInstPtr, (void *)args[0], (std::size_t)lhsLen);
    std::memcpy((char *)resInstPtr + lhsLen, (void *)args[1],
                (std::size_t)rhsLen);
    return (std::int64_t)resInstPtr;
  });
  // #string#substring ( this left right )
  externalFuncs.emplace("#string#substring", [this](Args args) {
    auto len = args[2] - args[1];
    char *resInstPtr = (char *)fastMalloc(len + 8);
    *(std::int64_t *)(resInstPtr) = len;
    resInstPtr += 8;

    auto srcContentPtr = (char *)args[0] + args[1];
    std::memcpy(resInstPtr, srcContentPtr, (std::size_t)len);
    return (std::int64_t)resInstPtr;
  });
  // #string#ord ( this pos )
  externalFuncs.emplace("#string#ord", [](Args args) {
    return (std::int64_t) * ((char *)args[0] + args[1]);
  });
  // #string#parseInt ( this )
  externalFuncs.emplace("#string#parseInt", [](Args args) {
    auto len = *((std::int64_t *)args[0] - 1);
    std::string str{(char *)args[0], (char *)args[0] + len};
    return std::stoll(str);
  });
  // #string#_ctor_ ( this )
  externalFuncs.emplace("#string#_ctor_",
                        [](Args args) -> std::int64_t { assert(false); });

  // getInt (  )
  externalFuncs.emplace("getInt", [](Args args) {
    std::int64_t res;
    std::cin >> res;
    return res;
  });
  // print ( str )
  externalFuncs.emplace("print", [this](Args args) {
    auto len = externalFuncs["#string#length"]({args[0]});
    auto str = std::string{(char *)args[0], (char *)args[0] + len};
    std::cout << str;
    return 0;
  });
  // println ( str )
  externalFuncs.emplace("println", [this](Args args) {
    externalFuncs["print"]({args[0]});
    std::cout << std::endl;
    return 0;
  });
  // _printInt ( x )
  externalFuncs.emplace("_printInt", [this](Args args) {
    std::cout << args[0];
    return 0;
  });
  externalFuncs.emplace("_printlnInt", [this](Args args) {
    std::cout << args[0] << std::endl;
    return 0;
  });
  // getString (  )
  externalFuncs.emplace("getString", [this](Args args) {
    std::string str;
    std::cin >> str;

    auto resInstPtr = (char *)fastMalloc(8 + str.length());
    *(std::int64_t *)resInstPtr = (std::int64_t)str.length();
    resInstPtr += 8;
    std::memcpy(resInstPtr, str.c_str(), str.length());
    return (std::int64_t)resInstPtr;
  });
  // toString ( i )
  externalFuncs.emplace("toString", [this](Args args) {
    auto str = std::to_string(args[0]);

    auto resInstPtr = (char *)fastMalloc(8 + str.length());
    *(std::int64_t *)resInstPtr = (std::int64_t)str.length();
    resInstPtr += 8;
    std::memcpy(resInstPtr, str.c_str(), str.length());
    return (std::int64_t)resInstPtr;
  });

  // memcpy ( dest src count )
  externalFuncs.emplace("memcpy", [](Args args) {
    std::memcpy((void *)args[0], (void *)args[1], (std::size_t)args[2]);
    return 0;
  });
}